

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMuxError WebPMuxGetFrame(WebPMux *mux,uint32_t nth,WebPMuxFrameInfo *frame)

{
  byte bVar1;
  WebPChunk *pWVar2;
  ushort *puVar3;
  WebPMuxError WVar4;
  WebPChunkId WVar5;
  uint32_t tag;
  WebPMuxImage *wpi;
  
  if (frame == (WebPMuxFrameInfo *)0x0 || mux == (WebPMux *)0x0) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }
  WVar4 = MuxImageGetNth(&mux->images,nth,&wpi);
  if (WVar4 != WEBP_MUX_OK) {
    return WVar4;
  }
  pWVar2 = wpi->header;
  if (pWVar2 == (WebPChunk *)0x0) {
    frame->x_offset = 0;
    frame->y_offset = 0;
    frame->duration = 1;
    frame->dispose_method = WEBP_MUX_DISPOSE_NONE;
    frame->blend_method = WEBP_MUX_BLEND;
    tag = wpi->img->tag;
  }
  else {
    if (pWVar2->tag != 0x464d4e41) {
      return WEBP_MUX_INVALID_ARGUMENT;
    }
    if ((pWVar2->data).size < 0x10) {
      return WEBP_MUX_BAD_DATA;
    }
    puVar3 = (ushort *)(pWVar2->data).bytes;
    frame->x_offset = (uint)(byte)puVar3[1] * 0x20000 + (uint)*puVar3 * 2;
    frame->y_offset =
         (uint)*(byte *)((long)puVar3 + 5) * 0x20000 + (uint)*(ushort *)((long)puVar3 + 3) * 2;
    bVar1 = *(byte *)((long)puVar3 + 0xf);
    frame->duration = (uint)*(uint3 *)(puVar3 + 6);
    frame->dispose_method = bVar1 & WEBP_MUX_DISPOSE_BACKGROUND;
    frame->blend_method = bVar1 >> 1 & WEBP_MUX_NO_BLEND;
    tag = 0x464d4e41;
  }
  WVar5 = ChunkGetIdFromTag(tag);
  frame->id = WVar5;
  WVar4 = SynthesizeBitstream(wpi,&frame->bitstream);
  return WVar4;
}

Assistant:

WebPMuxError WebPMuxGetFrame(
    const WebPMux* mux, uint32_t nth, WebPMuxFrameInfo* frame) {
  WebPMuxError err;
  WebPMuxImage* wpi;

  if (mux == NULL || frame == NULL) {
    return WEBP_MUX_INVALID_ARGUMENT;
  }

  // Get the nth WebPMuxImage.
  err = MuxImageGetNth((const WebPMuxImage**)&mux->images, nth, &wpi);
  if (err != WEBP_MUX_OK) return err;

  // Get frame info.
  if (wpi->header == NULL) {
    return MuxGetImageInternal(wpi, frame);
  } else {
    return MuxGetFrameInternal(wpi, frame);
  }
}